

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O3

int cfg_append_printable_line(autobuf *autobuf,char *fmt,...)

{
  char *pcVar1;
  char in_AL;
  byte bVar2;
  int iVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_f9;
  __va_list_tag local_f8;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  iVar3 = 0;
  if (autobuf != (autobuf *)0x0) {
    sVar4 = autobuf->_len;
    pcVar1 = autobuf->_buf;
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &stack0x00000008;
    local_f8.gp_offset = 0x10;
    local_f8.fp_offset = 0x30;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    iVar3 = abuf_vappendf(autobuf,fmt,&local_f8);
    if (-1 < iVar3) {
      bVar2 = pcVar1[sVar4];
      for (; (bVar2 != 0 && (sVar4 < autobuf->_len)); sVar4 = sVar4 + 1) {
        if ((bVar2 < 0x20) || ((bVar2 | 0x80) == 0xff)) {
          pcVar1[sVar4] = '.';
        }
        bVar2 = pcVar1[sVar4 + 1];
      }
      local_f9 = 10;
      abuf_memcpy(autobuf,&local_f9,1);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
cfg_append_printable_line(struct autobuf *autobuf, const char *fmt, ...) {
  unsigned char *_value;
  size_t len;
  int rv;
  va_list ap;

  if (autobuf == NULL)
    return 0;

  _value = (unsigned char *)abuf_getptr(autobuf) + abuf_getlen(autobuf);
  len = abuf_getlen(autobuf);

  va_start(ap, fmt);
  rv = abuf_vappendf(autobuf, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    return rv;
  }

  /* convert everything non-printable to '.' */
  while (*_value && len++ < abuf_getlen(autobuf)) {
    if (*_value < 32 || *_value == 127 || *_value == 255) {
      *_value = '.';
    }
    _value++;
  }
  abuf_append_uint8(autobuf, '\n');
  return 0;
}